

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O1

void srunner_send_evt(SRunner *sr,void *obj,cl_event evt)

{
  List *lp;
  int iVar1;
  undefined8 *puVar2;
  
  lp = sr->loglst;
  check_list_front(lp);
  while( true ) {
    iVar1 = check_list_at_end(lp);
    if (iVar1 != 0) break;
    puVar2 = (undefined8 *)check_list_val(lp);
    fflush((FILE *)*puVar2);
    (*(code *)puVar2[1])(sr,*puVar2,*(undefined4 *)((long)puVar2 + 0x14),obj,evt);
    fflush((FILE *)*puVar2);
    check_list_advance(lp);
  }
  return;
}

Assistant:

static void srunner_send_evt(SRunner * sr, void *obj, enum cl_event evt)
{
    List *l;

    l = sr->loglst;
    for(check_list_front(l); !check_list_at_end(l); check_list_advance(l))
    {
        Log *lg = (Log *)check_list_val(l);
        fflush(lg->lfile);
        lg->lfun(sr, lg->lfile, lg->mode, obj, evt);
        fflush(lg->lfile);
    }
}